

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O2

void __thiscall QDnsLookupPrivate::~QDnsLookupPrivate(QDnsLookupPrivate *this)

{
  *(undefined ***)this = &PTR__QDnsLookupPrivate_002ced08;
  std::_Optional_payload_base<QSslConfiguration>::_M_reset
            ((_Optional_payload_base<QSslConfiguration> *)&this->sslConfiguration);
  QDnsLookupReply::~QDnsLookupReply(&this->reply);
  QHostAddress::~QHostAddress((QHostAddress *)&this->nameserver);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&this->name);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QDnsLookupPrivate()
        : type(QDnsLookup::A)
        , port(0)
        , protocol(QDnsLookup::Standard)
    { }